

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlNextChar(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined *in_RAX;
  PyObject *pPVar2;
  undefined8 uVar3;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlNextChar");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlNextChar",&local_18);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_18 + 0x10);
      }
      xmlNextChar(uVar3);
      pPVar2 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlNextChar(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("xmlNextChar") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:xmlNextChar", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    xmlNextChar(ctxt);
    Py_INCREF(Py_None);
    return(Py_None);
}